

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<tinyusdz::value::half,3ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,
          array<tinyusdz::value::half,_3UL> *v)

{
  bool bVar1;
  pointer pSVar2;
  value_type *pvVar3;
  pointer pSVar4;
  optional<std::array<tinyusdz::value::half,_3UL>_> pv;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_38;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_30;
  double local_28;
  
  if (v == (array<tinyusdz::value::half,_3UL> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_28 = t;
    get_default_value<std::array<tinyusdz::value::half,3ul>>(&local_38,this);
    local_30.has_value_ = local_38.has_value_;
    if (local_38.has_value_ == true) goto LAB_0027d14a;
    pSVar2 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    t = local_28;
    if (pSVar2 == pSVar4) {
      return false;
    }
  }
  else {
    pSVar2 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar4 != pSVar2) {
    bVar1 = tinyusdz::value::TimeSamples::get<std::array<tinyusdz::value::half,_3UL>,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar1;
  }
  bVar1 = has_value(this);
  if (bVar1) {
    get_default_value<std::array<tinyusdz::value::half,3ul>>(&local_38,this);
    local_30.has_value_ = local_38.has_value_;
    if (local_38.has_value_ != false) {
LAB_0027d14a:
      local_30.contained._4_2_ = local_38.contained._4_2_;
      local_30.contained._0_4_ = local_38.contained._0_4_;
      pvVar3 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                         (&local_30);
      *(undefined4 *)v->_M_elems = *(undefined4 *)pvVar3->_M_elems;
      v->_M_elems[2].value = pvVar3->_M_elems[2].value;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }